

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O2

wostream * Centaurus::printc(wostream *os,wchar_t ch)

{
  int iVar1;
  wostream *pwVar2;
  wchar_t *pwVar3;
  wchar_t buf [16];
  
  iVar1 = iswgraph(ch);
  if (iVar1 == 0) {
    swprintf(buf,0x10,L"\\\\x%0X",(ulong)(uint)ch);
    pwVar2 = std::operator<<(os,buf);
    return pwVar2;
  }
  if (ch == L'\\') {
    pwVar3 = L"\\\\";
  }
  else {
    if (ch != L'\"') {
      pwVar2 = std::operator<<(os,ch);
      return pwVar2;
    }
    pwVar3 = L"\\\"";
  }
  pwVar2 = std::operator<<(os,pwVar3);
  return pwVar2;
}

Assistant:

static std::wostream& printc(std::wostream& os, wchar_t ch)
{
	if (!iswgraph(ch))
	{
		wchar_t buf[16];
		swprintf(buf, 16, L"\\\\x%0X", (wint_t)ch);
		return os << buf;
	}
	else
	{
		switch (ch)
		{
		case L'"':
			return os << L"\\\"";
		case L'\\':
			return os << L"\\\\";
		default:
			return os << ch;
		}
	}
}